

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder_get_data_format
                    (ma_decoder *pDecoder,ma_format *pFormat,ma_uint32 *pChannels,
                    ma_uint32 *pSampleRate,ma_channel *pChannelMap,size_t channelMapCap)

{
  ma_data_converter *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  ma_channel *in_R8;
  size_t in_R9;
  ma_result local_4;
  
  if (in_RDI == 0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    if (in_RSI != (undefined4 *)0x0) {
      *in_RSI = *(undefined4 *)(in_RDI + 0x88);
    }
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = *(undefined4 *)(in_RDI + 0x8c);
    }
    if (in_RCX != (ma_data_converter *)0x0) {
      in_RCX->formatIn = *(ma_format *)(in_RDI + 0x90);
    }
    if (in_R8 != (ma_channel *)0x0) {
      ma_data_converter_get_output_channel_map(in_RCX,in_R8,in_R9);
    }
    local_4 = MA_SUCCESS;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_decoder_get_data_format(ma_decoder* pDecoder, ma_format* pFormat, ma_uint32* pChannels, ma_uint32* pSampleRate, ma_channel* pChannelMap, size_t channelMapCap)
{
    if (pDecoder == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pFormat != NULL) {
        *pFormat = pDecoder->outputFormat;
    }

    if (pChannels != NULL) {
        *pChannels = pDecoder->outputChannels;
    }

    if (pSampleRate != NULL) {
        *pSampleRate = pDecoder->outputSampleRate;
    }

    if (pChannelMap != NULL) {
        ma_data_converter_get_output_channel_map(&pDecoder->converter, pChannelMap, channelMapCap);
    }

    return MA_SUCCESS;
}